

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)

{
  short sVar1;
  short sVar2;
  int iVar3;
  undefined4 local_1c;
  undefined4 local_18;
  uint32_t current_y;
  uint32_t current_x;
  int decision;
  uint8_t color_local;
  uint16_t Radius_local;
  uint16_t Ypos_local;
  uint16_t Xpos_local;
  
  current_y = (uint)Radius * -2 + 3;
  local_1c = (uint)Radius;
  for (local_18 = 0; local_18 <= local_1c; local_18 = local_18 + 1) {
    sVar1 = (short)local_18;
    sVar2 = (short)local_1c;
    EPD_DrawPixel(Xpos + sVar1,Ypos - sVar2,color);
    EPD_DrawPixel(Xpos - sVar1,Ypos - sVar2,color);
    EPD_DrawPixel(Xpos + sVar2,Ypos - sVar1,color);
    EPD_DrawPixel(Xpos - sVar2,Ypos - sVar1,color);
    EPD_DrawPixel(Xpos + sVar1,Ypos + sVar2,color);
    EPD_DrawPixel(Xpos - sVar1,Ypos + sVar2,color);
    EPD_DrawPixel(Xpos + sVar2,Ypos + sVar1,color);
    EPD_DrawPixel(Xpos - sVar2,Ypos + sVar1,color);
    if ((int)current_y < 0) {
      iVar3 = local_18 * 4 + 6;
    }
    else {
      iVar3 = (local_18 - local_1c) * 4 + 10;
      local_1c = local_1c - 1;
    }
    current_y = iVar3 + current_y;
  }
  return;
}

Assistant:

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)
{
	  int   decision;    	/* Decision Variable */ 
	  uint32_t  current_x;   	/* Current X Value */
	  uint32_t  current_y;   	/* Current Y Value */
	  
	  decision = 3 - (Radius << 1);
	  current_x = 0;
	  current_y = Radius;
	  
	  while (current_x <= current_y)
	  {
		    EPD_DrawPixel((Xpos + current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos + current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos + current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos + current_x), color);
		    
		    if (decision < 0)
		    { 
				decision += (current_x << 2) + 6;
		    }
		    else
		    {
			      decision += ((current_x - current_y) << 2) + 10;
			      current_y--;
		    }
		    current_x++;
	  } 
}